

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__linear_to_rgbe(uchar *rgbe,float *linear)

{
  float *in_RSI;
  undefined1 *in_RDI;
  double dVar1;
  float normalize;
  float maxcomp;
  int exponent;
  float local_2c;
  float local_28;
  float local_24;
  char local_14 [4];
  float *local_10;
  undefined1 *local_8;
  
  if (in_RSI[1] < in_RSI[2] || in_RSI[1] == in_RSI[2]) {
    local_24 = in_RSI[2];
  }
  else {
    local_24 = in_RSI[1];
  }
  if (*in_RSI <= local_24) {
    if (in_RSI[1] < in_RSI[2] || in_RSI[1] == in_RSI[2]) {
      local_2c = in_RSI[2];
    }
    else {
      local_2c = in_RSI[1];
    }
    local_28 = local_2c;
  }
  else {
    local_28 = *in_RSI;
  }
  if (1e-32 <= local_28) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    dVar1 = frexp((double)local_28,(int *)local_14);
    local_28 = ((float)dVar1 * 256.0) / local_28;
    *local_8 = (char)(int)(*local_10 * local_28);
    local_8[1] = (char)(int)(local_10[1] * local_28);
    local_8[2] = (char)(int)(local_10[2] * local_28);
    local_8[3] = local_14[0] + -0x80;
  }
  else {
    in_RDI[3] = 0;
    in_RDI[2] = 0;
    in_RDI[1] = 0;
    *in_RDI = 0;
  }
  return;
}

Assistant:

static void stbiw__linear_to_rgbe(unsigned char *rgbe, float *linear) {
    int exponent;
    float maxcomp = stbiw__max(linear[0], stbiw__max(linear[1], linear[2]));

    if (maxcomp < 1e-32f) {
        rgbe[0] = rgbe[1] = rgbe[2] = rgbe[3] = 0;
    } else {
        float normalize = (float) frexp(maxcomp, &exponent) * 256.0f / maxcomp;

        rgbe[0] = (unsigned char) (linear[0] * normalize);
        rgbe[1] = (unsigned char) (linear[1] * normalize);
        rgbe[2] = (unsigned char) (linear[2] * normalize);
        rgbe[3] = (unsigned char) (exponent + 128);
    }
}